

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O2

ENetPacket * enet_packet_create(void *data,size_t dataLength,enet_uint32 flags)

{
  ENetPacket *__ptr;
  enet_uint8 *__dest;
  
  __ptr = (ENetPacket *)enet_malloc(0x30);
  if (__ptr == (ENetPacket *)0x0) {
LAB_00103eb7:
    __ptr = (ENetPacket *)0x0;
  }
  else {
    if ((flags & 4) == 0) {
      if (dataLength == 0) {
        __ptr->data = (enet_uint8 *)0x0;
      }
      else {
        __dest = (enet_uint8 *)enet_malloc(dataLength);
        __ptr->data = __dest;
        if (__dest == (enet_uint8 *)0x0) {
          enet_free(__ptr);
          goto LAB_00103eb7;
        }
        if (data != (void *)0x0) {
          memcpy(__dest,data,dataLength);
        }
      }
    }
    else {
      __ptr->data = (enet_uint8 *)data;
    }
    __ptr->referenceCount = 0;
    __ptr->flags = flags;
    __ptr->dataLength = dataLength;
    __ptr->freeCallback = (ENetPacketFreeCallback)0x0;
    __ptr->userData = (void *)0x0;
  }
  return __ptr;
}

Assistant:

ENetPacket *
enet_packet_create (const void * data, size_t dataLength, enet_uint32 flags)
{
    ENetPacket * packet = (ENetPacket *) enet_malloc (sizeof (ENetPacket));
    if (packet == NULL)
      return NULL;

    if (flags & ENET_PACKET_FLAG_NO_ALLOCATE)
      packet -> data = (enet_uint8 *) data;
    else
    if (dataLength <= 0)
      packet -> data = NULL;
    else
    {
       packet -> data = (enet_uint8 *) enet_malloc (dataLength);
       if (packet -> data == NULL)
       {
          enet_free (packet);
          return NULL;
       }

       if (data != NULL)
         memcpy (packet -> data, data, dataLength);
    }

    packet -> referenceCount = 0;
    packet -> flags = flags;
    packet -> dataLength = dataLength;
    packet -> freeCallback = NULL;
    packet -> userData = NULL;

    return packet;
}